

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.cpp
# Opt level: O3

bool __thiscall
llbuild::buildsystem::ShellCommand::processMakefileDiscoveredDependencies
          (ShellCommand *this,BuildSystem *system,TaskInterface ti,QueueJobContext *context,
          StringRef depsPath,MemoryBuffer *input,bool ignoreSubsequentOutputs)

{
  bool bVar1;
  MakefileDepsParser local_70;
  ParseActions local_50;
  BuildSystem *local_48;
  void *local_40;
  void *local_38;
  ShellCommand *local_30;
  char *local_28;
  size_t sStack_20;
  int local_18;
  
  local_38 = ti.ctx;
  local_40 = ti.impl;
  local_28 = depsPath.Data;
  sStack_20 = depsPath.Length;
  local_50._vptr_ParseActions = (_func_int **)&PTR__ParseActions_0020c450;
  local_18 = 0;
  local_70.data.Data = input->BufferStart;
  local_70.data.Length = (long)input->BufferEnd - (long)local_70.data.Data;
  local_70.ignoreSubsequentOutputs = ignoreSubsequentOutputs;
  local_70.actions = &local_50;
  local_48 = system;
  local_30 = this;
  llbuild::core::MakefileDepsParser::parse(&local_70);
  bVar1 = local_18 == 0;
  llbuild::core::MakefileDepsParser::ParseActions::~ParseActions(&local_50);
  return bVar1;
}

Assistant:

bool ShellCommand::processMakefileDiscoveredDependencies(BuildSystem& system,
                                                         TaskInterface ti,
                                                         QueueJobContext* context,
                                                         StringRef depsPath,
                                                         llvm::MemoryBuffer* input,
                                                         bool ignoreSubsequentOutputs) {
  // Parse the output.
  //
  // We just ignore the rule, and add any dependency that we encounter in the
  // file.
  struct DepsActions : public core::MakefileDepsParser::ParseActions {
    BuildSystem& system;
    TaskInterface ti;
    ShellCommand* command;
    StringRef depsPath;
    unsigned numErrors{0};

    DepsActions(BuildSystem& system, TaskInterface ti,
                ShellCommand* command, StringRef depsPath)
        : system(system), ti(ti), command(command), depsPath(depsPath) {}

    virtual void error(StringRef message, uint64_t position) override {
      std::string msg;
      raw_string_ostream msgStream(msg);
      msgStream << "error reading dependency file '" << depsPath << "': "
          << message << " at position " << position;
      system.getDelegate().commandHadError(command, msgStream.str());
      ++numErrors;
    }

    virtual void actOnRuleDependency(StringRef dependency,
                                     StringRef unescapedWord) override {
      if (llvm::sys::path::is_absolute(unescapedWord)) {
        ti.discoveredDependency(BuildKey::makeNode(unescapedWord).toData());
        system.getDelegate().commandFoundDiscoveredDependency(command, unescapedWord, DiscoveredDependencyKind::Input);
        return;
      }

      // Generate absolute path
      //
      // NOTE: This is making the assumption that relative paths coming in a
      // dependency file are in relation to the explictly set working
      // directory, or the current working directory when it has not been set.
      SmallString<PATH_MAX> absPath = StringRef(command->workingDirectory);
      llvm::sys::path::append(absPath, unescapedWord);
      llvm::sys::fs::make_absolute(absPath);

      ti.discoveredDependency(BuildKey::makeNode(absPath).toData());
      system.getDelegate().commandFoundDiscoveredDependency(command, absPath, DiscoveredDependencyKind::Input);
    }

    virtual void actOnRuleStart(StringRef name,
                                const StringRef unescapedWord) override {}

    virtual void actOnRuleEnd() override {}
  };

  DepsActions actions(system, ti, this, depsPath);
  core::MakefileDepsParser(input->getBuffer(), actions, ignoreSubsequentOutputs).parse();
  return actions.numErrors == 0;
}